

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_quads.cpp
# Opt level: O2

void __thiscall CLayerQuads::CLayerQuads(CLayerQuads *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  CLayer::CLayer(&this->super_CLayer);
  (this->super_CLayer)._vptr_CLayer = (_func_int **)&PTR__CLayerQuads_00208388;
  array<CQuad,_allocator_default<CQuad>_>::init(&this->m_lQuads,in_RSI);
  (this->super_CLayer).m_Type = 3;
  str_copy((this->super_CLayer).m_aName,"Quads",0xc);
  this->m_Image = -1;
  return;
}

Assistant:

CLayerQuads::CLayerQuads()
{
	m_Type = LAYERTYPE_QUADS;
	str_copy(m_aName, "Quads", sizeof(m_aName));
	m_Image = -1;
}